

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O0

void __thiscall CfdLogger_FinalizeLogger_Test::TestBody(CfdLogger_FinalizeLogger_Test *this)

{
  bool bVar1;
  AssertHelper local_30;
  Message local_28 [3];
  CfdLogger_FinalizeLogger_Test *local_10;
  CfdLogger_FinalizeLogger_Test *this_local;
  
  local_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::FinalizeLogger(false);
    }
  }
  else {
    testing::Message::Message(local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x1b,
               "Expected: (FinalizeLogger()) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_30,local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message(local_28);
  }
  return;
}

Assistant:

TEST(CfdLogger, FinalizeLogger) {
  EXPECT_NO_THROW((FinalizeLogger()));
}